

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerThreadManager.cxx
# Opt level: O2

optional<dap::StackTraceResponse> * __thiscall
cmDebugger::cmDebuggerThreadManager::GetThreadStackTraceResponse
          (optional<dap::StackTraceResponse> *__return_storage_ptr__,cmDebuggerThreadManager *this,
          int64_t id)

{
  _List_node_base *p_Var1;
  StackTraceResponse SStack_38;
  
  p_Var1 = (_List_node_base *)this;
  do {
    p_Var1 = (((list<std::shared_ptr<cmDebugger::cmDebuggerThread>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerThread>_>_>
                *)&p_Var1->_M_next)->
             super__List_base<std::shared_ptr<cmDebugger::cmDebuggerThread>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerThread>_>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var1 == (_List_node_base *)this) {
      (__return_storage_ptr__->super__Optional_base<dap::StackTraceResponse,_false,_false>).
      _M_payload.super__Optional_payload<dap::StackTraceResponse,_true,_false,_false>.
      super__Optional_payload_base<dap::StackTraceResponse>._M_engaged = false;
      return __return_storage_ptr__;
    }
  } while (**(long **)(p_Var1 + 1) != id);
  GetStackTraceResponse(&SStack_38,(shared_ptr<cmDebugger::cmDebuggerThread> *)(p_Var1 + 1));
  std::_Optional_payload_base<dap::StackTraceResponse>::
  _Optional_payload_base<dap::StackTraceResponse>
            ((_Optional_payload_base<dap::StackTraceResponse> *)__return_storage_ptr__,&SStack_38);
  std::vector<dap::StackFrame,_std::allocator<dap::StackFrame>_>::~vector(&SStack_38.stackFrames);
  return __return_storage_ptr__;
}

Assistant:

cm::optional<dap::StackTraceResponse>
cmDebuggerThreadManager::GetThreadStackTraceResponse(int64_t id)
{
  auto it = find_if(Threads.begin(), Threads.end(),
                    [&](const std::shared_ptr<cmDebuggerThread>& t) {
                      return t->GetId() == id;
                    });

  if (it == Threads.end()) {
    return {};
  }

  return GetStackTraceResponse(*it);
}